

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O2

void re_concat_onto(re_context *ctx,re_machine *dest,re_machine *rhs)

{
  re_machine rVar1;
  re_machine new_machine;
  
  if (dest->init == -1) {
    rVar1 = *rhs;
  }
  else {
    re_init_machine(ctx,&new_machine);
    re_set_trans(ctx,new_machine.init,dest->init,'\x01');
    re_set_trans(ctx,dest->final,rhs->init,'\x01');
    re_set_trans(ctx,rhs->final,new_machine.final,'\x01');
    rVar1.final = new_machine.final;
    rVar1.init = new_machine.init;
  }
  *dest = rVar1;
  return;
}

Assistant:

static void re_concat_onto(re_context *ctx,
                           re_machine *dest, re_machine *rhs)
{
    /* check for a null destination machine */
    if (re_is_machine_null(ctx, dest))
    {
        /* 
         *   the first machine is null - simply copy the second machine
         *   onto the first unchanged 
         */
        *dest = *rhs;
    }
    else
    {
        re_machine new_machine;
        
        /* build the concatenated machine */
        re_build_concat(ctx, &new_machine, dest, rhs);

        /* copy the concatenated machine onto the first machine */
        *dest = new_machine;
    }
}